

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::request_subgroup_feature(CompilerGLSL *this,Feature feature)

{
  bool bVar1;
  char *pcVar2;
  allocator local_39;
  string local_38;
  Candidate local_18;
  Feature local_14;
  Candidate khr_extension;
  Feature feature_local;
  CompilerGLSL *this_local;
  
  local_14 = feature;
  _khr_extension = this;
  if (((this->options).vulkan_semantics & 1U) == 0) {
    bVar1 = ShaderSubgroupSupportHelper::is_feature_requested
                      (&this->shader_subgroup_supporter,feature);
    if (!bVar1) {
      Compiler::force_recompile(&this->super_Compiler);
    }
    ShaderSubgroupSupportHelper::request_feature(&this->shader_subgroup_supporter,local_14);
  }
  else {
    local_18 = ShaderSubgroupSupportHelper::get_KHR_extension_for_feature(feature);
    pcVar2 = ShaderSubgroupSupportHelper::get_extension_name(local_18);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
    require_extension_internal(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void CompilerGLSL::request_subgroup_feature(ShaderSubgroupSupportHelper::Feature feature)
{
	if (options.vulkan_semantics)
	{
		auto khr_extension = ShaderSubgroupSupportHelper::get_KHR_extension_for_feature(feature);
		require_extension_internal(ShaderSubgroupSupportHelper::get_extension_name(khr_extension));
	}
	else
	{
		if (!shader_subgroup_supporter.is_feature_requested(feature))
			force_recompile();
		shader_subgroup_supporter.request_feature(feature);
	}
}